

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O1

void prvTidyFreeAttrPriorityList(TidyDocImpl *doc)

{
  tmbstr *pptVar1;
  ulong uVar2;
  tmbstr ptVar3;
  
  if ((doc->attribs).priorityAttribs.list != (tmbstr *)0x0) {
    pptVar1 = (doc->attribs).priorityAttribs.list;
    ptVar3 = *pptVar1;
    if (ptVar3 != (tmbstr)0x0) {
      uVar2 = 1;
      do {
        (*doc->allocator->vtbl->free)(doc->allocator,ptVar3);
        pptVar1 = (doc->attribs).priorityAttribs.list;
        ptVar3 = pptVar1[uVar2];
        uVar2 = (ulong)((int)uVar2 + 1);
      } while (ptVar3 != (tmbstr)0x0);
    }
    (*doc->allocator->vtbl->free)(doc->allocator,pptVar1);
    return;
  }
  return;
}

Assistant:

void TY_(FreeAttrPriorityList)( TidyDocImpl* doc )
{
    PriorityAttribs *priorities = &(doc->attribs.priorityAttribs);

    if ( priorities->list )
    {
        uint i = 0;
        while ( priorities->list[i] != NULL )
        {
            TidyFree( doc->allocator, priorities->list[i] );
            i++;
        }

        TidyFree( doc->allocator, priorities->list );
    }
}